

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  uint *puVar1;
  float fVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  uchar *puVar7;
  long lVar8;
  ImFont *pIVar9;
  int iVar10;
  ImFontAtlasCustomRect *pIVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint *puVar16;
  uint uVar17;
  int iVar18;
  size_t __n;
  int iVar19;
  long lVar20;
  long lVar21;
  float fVar22;
  size_t local_60;
  ImVec2 uv1;
  ImVec2 uv0;
  
  if ((atlas->TexPixelsAlpha8 == (uchar *)0x0) && (atlas->TexPixelsRGBA32 == (uint *)0x0)) {
    __assert_fail("atlas->TexPixelsAlpha8 != __null || atlas->TexPixelsRGBA32 != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                  ,0xace,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
  }
  pIVar11 = ImFontAtlas::GetCustomRectByIndex(atlas,atlas->PackIdMouseCursors);
  uVar3 = pIVar11->X;
  if (uVar3 == 0xffff) {
    __assert_fail("r->IsPacked()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                  ,0xa5d,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
  }
  if ((atlas->Flags & 2) == 0) {
    if ((pIVar11->Width != 0xd9) || (pIVar11->Height != 0x1b)) {
      __assert_fail("r->Width == FONT_ATLAS_DEFAULT_TEX_DATA_W * 2 + 1 && r->Height == FONT_ATLAS_DEFAULT_TEX_DATA_H"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                    ,0xa63,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,(uint)uVar3,(uint)pIVar11->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'.',0xffffffff);
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,uVar3 + 0x6d,(uint)pIVar11->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'X',0xffffffff);
    }
    else {
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,(uint)uVar3,(uint)pIVar11->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'.',0xff);
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,uVar3 + 0x6d,(uint)pIVar11->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'X',0xff);
    }
  }
  else {
    if ((pIVar11->Width != 2) || (pIVar11->Height != 2)) {
      __assert_fail("r->Width == 2 && r->Height == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                    ,0xa74,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    iVar15 = atlas->TexWidth;
    iVar19 = (uint)pIVar11->Y * iVar15 + (uint)uVar3;
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      puVar16 = atlas->TexPixelsRGBA32;
      puVar1 = puVar16 + (iVar15 + iVar19);
      puVar1[0] = 0xffffffff;
      puVar1[1] = 0xffffffff;
      puVar16 = puVar16 + iVar19;
      puVar16[0] = 0xffffffff;
      puVar16[1] = 0xffffffff;
    }
    else {
      atlas->TexPixelsAlpha8[(long)(iVar15 + iVar19) + 1] = 0xff;
      atlas->TexPixelsAlpha8[iVar15 + iVar19] = 0xff;
      atlas->TexPixelsAlpha8[(long)iVar19 + 1] = 0xff;
      atlas->TexPixelsAlpha8[iVar19] = 0xff;
    }
  }
  uVar3 = pIVar11->Y;
  fVar2 = (atlas->TexUvScale).y;
  (atlas->TexUvWhitePixel).x = ((float)pIVar11->X + 0.5) * (atlas->TexUvScale).x;
  (atlas->TexUvWhitePixel).y = ((float)uVar3 + 0.5) * fVar2;
  if ((atlas->Flags & 4) == 0) {
    pIVar11 = ImFontAtlas::GetCustomRectByIndex(atlas,atlas->PackIdLines);
    if (pIVar11->X == 0xffff) {
      __assert_fail("r->IsPacked()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                    ,0xa89,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
    }
    local_60 = 0;
    lVar21 = -0x40;
    iVar19 = 0;
    iVar15 = 0;
    do {
      if ((ulong)pIVar11->Height <= lVar21 + 0x40U) {
        __assert_fail("pad_left + line_width + pad_right == r->Width && y < r->Height",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                      ,0xa93,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
      }
      uVar3 = pIVar11->Width;
      uVar13 = iVar15 + (uint)uVar3;
      uVar14 = uVar13 >> 1;
      iVar10 = (int)lVar21;
      uVar17 = iVar10 + uVar14 + 0x40;
      iVar18 = (uVar3 - uVar14) + iVar15;
      puVar7 = atlas->TexPixelsAlpha8;
      if (puVar7 == (uchar *)0x0) {
        puVar16 = atlas->TexPixelsRGBA32;
        uVar4 = pIVar11->X;
        uVar5 = pIVar11->Y;
        iVar6 = atlas->TexWidth;
        puVar1 = puVar16 + ((iVar10 + (uint)uVar5 + 0x40) * iVar6 + (uint)uVar4);
        if (1 < uVar13) {
          memset(puVar1,0,(ulong)(uVar14 + (uVar14 == 0)) << 2);
        }
        if (lVar21 != -0x40) {
          memset(puVar1 + uVar14,0xff,local_60);
        }
        if (uVar17 != uVar3) {
          puVar16 = puVar16 + (ulong)(iVar6 * ((uint)uVar5 + iVar19) + (uint)uVar4) +
                              (ulong)uVar14 + lVar21 + 0x40;
          __n = (ulong)(iVar18 + (uint)(iVar18 == 0)) << 2;
          goto LAB_001683cb;
        }
      }
      else {
        uVar4 = pIVar11->X;
        uVar5 = pIVar11->Y;
        iVar6 = atlas->TexWidth;
        if (1 < uVar13) {
          memset(puVar7 + ((iVar10 + (uint)uVar5 + 0x40) * iVar6 + (uint)uVar4),0,
                 (ulong)(uVar14 + (uVar14 == 0)));
        }
        if (lVar21 != -0x40) {
          memset(puVar7 + ((iVar10 + (uint)uVar5 + 0x40) * iVar6 + (uint)uVar4) + uVar14,0xff,
                 lVar21 + 0x40U);
        }
        if (uVar17 != uVar3) {
          puVar16 = (uint *)(puVar7 + lVar21 + (ulong)(iVar6 * ((uint)uVar5 + iVar19) + (uint)uVar4)
                                               + (ulong)uVar14 + 0x40);
          __n = (size_t)(iVar18 + (uint)(iVar18 == 0));
LAB_001683cb:
          memset(puVar16,0,__n);
        }
      }
      uVar3 = pIVar11->X;
      fVar2 = (atlas->TexUvScale).x;
      fVar22 = (atlas->TexUvScale).y;
      fVar22 = ((float)(int)(iVar10 + 0x41 + (uint)pIVar11->Y) * fVar22 +
               (float)(int)(iVar10 + 0x40 + (uint)pIVar11->Y) * fVar22) * 0.5;
      (&atlas->TexUvLines[0].x)[local_60] = (float)((uVar14 + uVar3) - 1) * fVar2;
      (&atlas->TexUvLines[0].y)[local_60] = fVar22;
      (&atlas->TexUvLines[0].z)[local_60] = (float)(iVar10 + uVar14 + uVar3 + 0x41) * fVar2;
      (&atlas->TexUvLines[0].w)[local_60] = fVar22;
      iVar15 = iVar15 + -1;
      iVar19 = iVar19 + 1;
      local_60 = local_60 + 4;
      lVar21 = lVar21 + 1;
    } while (lVar21 != 0);
  }
  if (0 < (atlas->CustomRects).Size) {
    lVar21 = 0;
    lVar20 = 0;
    do {
      pIVar11 = (atlas->CustomRects).Data;
      lVar8 = *(long *)((long)&pIVar11->Font + lVar21);
      if ((lVar8 != 0) && (*(int *)((long)&pIVar11->GlyphID + lVar21) != 0)) {
        if (*(ImFontAtlas **)(lVar8 + 0x40) != atlas) {
          __assert_fail("r->Font->ContainerAtlas == atlas",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                        ,0xada,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
        }
        uv0.x = 0.0;
        uv0.y = 0.0;
        uv1.x = 0.0;
        uv1.y = 0.0;
        ImFontAtlas::CalcCustomRectUV
                  (atlas,(ImFontAtlasCustomRect *)((long)&pIVar11->Width + lVar21),&uv0,&uv1);
        fVar2 = *(float *)((long)&(pIVar11->GlyphOffset).x + lVar21);
        fVar22 = *(float *)((long)&(pIVar11->GlyphOffset).y + lVar21);
        ImFont::AddGlyph(*(ImFont **)((long)&pIVar11->Font + lVar21),(ImFontConfig *)0x0,
                         *(ImWchar *)((long)&pIVar11->GlyphID + lVar21),fVar2,fVar22,
                         (float)*(ushort *)((long)&pIVar11->Width + lVar21) + fVar2,
                         (float)*(ushort *)((long)&pIVar11->Height + lVar21) + fVar22,uv0.x,uv0.y,
                         uv1.x,uv1.y,*(float *)((long)&pIVar11->GlyphAdvanceX + lVar21));
      }
      lVar20 = lVar20 + 1;
      lVar21 = lVar21 + 0x20;
    } while (lVar20 < (atlas->CustomRects).Size);
  }
  uVar13 = (atlas->Fonts).Size;
  if (0 < (int)uVar13) {
    lVar21 = 0;
    do {
      pIVar9 = (atlas->Fonts).Data[lVar21];
      if (pIVar9->DirtyLookupTables == true) {
        ImFont::BuildLookupTable(pIVar9);
      }
      lVar21 = lVar21 + 1;
      uVar13 = (atlas->Fonts).Size;
    } while (lVar21 < (int)uVar13);
  }
  if (0 < (int)uVar13) {
    uVar12 = 0;
    do {
      if ((long)(atlas->Fonts).Size <= (long)uVar12) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                      ,0x68b,"T &ImVector<ImFont *>::operator[](int) [T = ImFont *]");
      }
      pIVar9 = (atlas->Fonts).Data[uVar12];
      if (pIVar9->EllipsisChar == 0xffff) {
        lVar21 = 0;
        do {
          uVar3 = *(ushort *)((long)&DAT_0038621c + lVar21);
          if ((((ulong)uVar3 < (ulong)(long)(pIVar9->IndexLookup).Size) &&
              ((pIVar9->IndexLookup).Data[uVar3] != 0xffff)) &&
             ((pIVar9->Glyphs).Data != (ImFontGlyph *)0x0)) {
            pIVar9->EllipsisChar = uVar3;
            break;
          }
          lVar21 = lVar21 + 2;
        } while (lVar21 == 2);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar13);
  }
  return;
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL || atlas->TexPixelsRGBA32 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    // Ellipsis character is required for rendering elided text. We prefer using U+2026 (horizontal ellipsis).
    // However some old fonts may contain ellipsis at U+0085. Here we auto-detect most suitable ellipsis character.
    // FIXME: Also note that 0x2026 is currently seldom included in our font ranges. Because of this we are more likely to use three individual dots.
    for (int i = 0; i < atlas->Fonts.size(); i++)
    {
        ImFont* font = atlas->Fonts[i];
        if (font->EllipsisChar != (ImWchar)-1)
            continue;
        const ImWchar ellipsis_variants[] = { (ImWchar)0x2026, (ImWchar)0x0085 };
        for (int j = 0; j < IM_ARRAYSIZE(ellipsis_variants); j++)
            if (font->FindGlyphNoFallback(ellipsis_variants[j]) != NULL) // Verify glyph exists
            {
                font->EllipsisChar = ellipsis_variants[j];
                break;
            }
    }
}